

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O2

void * __thiscall
BitSetImplement<std::bitset<128UL>,_KDefectiveRDS>::setIntersection
          (BitSetImplement<std::bitset<128UL>,_KDefectiveRDS> *this,void *A,void *B)

{
  _Base_bitset<2UL> *p_Var1;
  _Base_bitset<2UL> _Var2;
  
  p_Var1 = (_Base_bitset<2UL> *)operator_new(0x10);
  _Var2._M_w = (_WordT  [2])std::operator&((bitset<128UL> *)A,(bitset<128UL> *)B);
  *&p_Var1->_M_w = _Var2._M_w;
  return p_Var1;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setIntersection(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) & (*__B__);
	return __C__;
}